

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_client.cpp
# Opt level: O3

int main(void)

{
  CppNet net;
  _Any_data local_48;
  undefined1 local_38 [16];
  CppNet local_28;
  
  local_28._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28._cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cppnet::CppNet::Init(&local_28,1);
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = ConnectFunc;
  local_38._8_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
       ::_M_invoke;
  local_38._0_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<cppnet::CNSocket>,_unsigned_int),_void_(*)(std::shared_ptr<cppnet::CNSocket>,_unsigned_int)>
       ::_M_manager;
  cppnet::CppNet::SetConnectionCallback(&local_28,(connect_call_back *)&local_48);
  if ((code *)local_38._0_8_ != (code *)0x0) {
    (*(code *)local_38._0_8_)(&local_48,&local_48,3);
  }
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"127.0.0.1","");
  cppnet::CppNet::Connection(&local_28,(string *)&local_48,0x22d9);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  local_48._M_unused._M_object = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"127.0.0.1","");
  cppnet::CppNet::Connection(&local_28,(string *)&local_48,0x22da);
  if ((undefined1 *)local_48._M_unused._0_8_ != local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  cppnet::Sleep(2000);
  cppnet::CppNet::~CppNet(&local_28);
  return 0;
}

Assistant:

int main() {

    cppnet::CppNet net;
    net.Init(1);
    net.SetConnectionCallback(ConnectFunc);

    net.Connection("127.0.0.1", 8921);
    net.Connection("127.0.0.1", 8922);

    Sleep(2000);
}